

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDeclNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *name)

{
  int iVar1;
  Grammar *pGVar2;
  XercesAttGroupInfo *pXVar3;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  pGVar2 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if (pGVar2 != (Grammar *)0x0) {
    iVar1 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[5])(pGVar2);
    if (iVar1 == 1) {
      pXVar3 = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                         ((RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>
                           *)pGVar2[9].super_XSerializable._vptr_XSerializable,name);
      goto LAB_003211b2;
    }
  }
  pXVar3 = (XercesAttGroupInfo *)0x0;
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,uriStr,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
LAB_003211b2:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return pXVar3;
}

Assistant:

inline XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDeclNS(const DOMElement* const elem,
                                             const XMLCh* const uriStr,
                                             const XMLCh* const name) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // Get grammar information
    // ------------------------------------------------------------------
    Grammar* aGrammar = fGrammarResolver->getGrammar(uriStr);

    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {

        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
        return 0;
    }

    XercesAttGroupInfo* attGroupInfo = ((SchemaGrammar*)aGrammar)->getAttGroupInfoRegistry()->get(name);

    return attGroupInfo;
}